

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O2

void __thiscall
pstore::basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits>::do_rollover
          (basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *this)

{
  bool bVar1;
  int in_ESI;
  uint index;
  string sStack_68;
  string local_48;
  
  close(this,in_ESI);
  index = this->num_backups_;
  while (index != 0) {
    basic_rotating_log<pstore::fstream_traits,pstore::file_system_traits>::make_file_name_abi_cxx11_
              (&local_48,this,index - 1);
    basic_rotating_log<pstore::fstream_traits,pstore::file_system_traits>::make_file_name_abi_cxx11_
              (&sStack_68,this,index);
    bVar1 = pstore::file::exists(&local_48);
    if (bVar1) {
      bVar1 = pstore::file::exists(&sStack_68);
      if (bVar1) {
        file_system_traits::unlink((char *)&sStack_68);
      }
      file_system_traits::rename((char *)&local_48,(char *)&sStack_68);
    }
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&local_48);
    index = index - 1;
  }
  return;
}

Assistant:

void basic_rotating_log<StreamTraits, FileSystemTraits>::do_rollover () {
        this->close ();

        for (auto index = num_backups_; index > 0; --index) {
            std::string const & source = this->make_file_name (index - 1);
            std::string const & dest = this->make_file_name (index);
            if (file_system_traits_.exists (source)) {
                if (file_system_traits_.exists (dest)) {
                    file_system_traits_.unlink (dest);
                }
                // TODO: compress the old files rather than simply rename them?
                file_system_traits_.rename (source, dest);
            }
        }

        // Clear the stream contents. Not an issue if we're really using files (because we're
        // using a different file) but, for example, writing to a single ostringstream we'll
        // need to clear the output stream.
        stream_traits_.clear (stream_);
    }